

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzer.cpp
# Opt level: O2

void __thiscall EnrichableI2cAnalyzer::~EnrichableI2cAnalyzer(EnrichableI2cAnalyzer *this)

{
  EnrichableAnalyzerSubprocess *pEVar1;
  EnrichableI2cAnalyzerResults *pEVar2;
  EnrichableI2cAnalyzerSettings *pEVar3;
  
  *(undefined ***)this = &PTR__EnrichableI2cAnalyzer_00110c60;
  Analyzer::KillThread();
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&(this->mArrowLocataions).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
  EnrichableI2cSimulationDataGenerator::~EnrichableI2cSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  pEVar1 = (this->mSubprocess)._M_ptr;
  if (pEVar1 != (EnrichableAnalyzerSubprocess *)0x0) {
    (*pEVar1->_vptr_EnrichableAnalyzerSubprocess[1])();
  }
  pEVar2 = (this->mResults)._M_ptr;
  if (pEVar2 != (EnrichableI2cAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pEVar2 + 8))();
  }
  pEVar3 = (this->mSettings)._M_ptr;
  if (pEVar3 != (EnrichableI2cAnalyzerSettings *)0x0) {
    (**(code **)(*(long *)pEVar3 + 8))();
  }
  Analyzer::~Analyzer((Analyzer *)this);
  return;
}

Assistant:

EnrichableI2cAnalyzer::~EnrichableI2cAnalyzer()
{
	KillThread();
}